

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

FRAME_STATS * accumulate_frame_stats(FRAME_STATS *mb_stats,int mb_rows,int mb_cols)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  FRAME_STATS *in_RDI;
  FRAME_STATS *stats;
  FRAME_STATS mb_stat;
  int j;
  int i;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  int local_70;
  int local_6c;
  int local_68;
  double local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  long local_30;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_RSI;
  memset(in_RDI,0,0x78);
  in_RDI->image_data_start_row = -1;
  for (local_18 = 0; local_18 < local_c; local_18 = local_18 + 1) {
    for (local_14 = 0; local_14 < local_10; local_14 = local_14 + 1) {
      memcpy(&local_90,(void *)(local_8 + (long)(local_18 * local_10 + local_14) * 0x78),0x78);
      in_RDI->brightness_factor = local_20 + in_RDI->brightness_factor;
      in_RDI->coded_error = local_80 + in_RDI->coded_error;
      in_RDI->frame_avg_wavelet_energy = local_88 + in_RDI->frame_avg_wavelet_energy;
      if ((in_RDI->image_data_start_row == -1) && (local_54 != -1)) {
        in_RDI->image_data_start_row = local_54;
      }
      in_RDI->inter_count = local_6c + in_RDI->inter_count;
      in_RDI->intra_error = local_90 + in_RDI->intra_error;
      in_RDI->intra_factor = local_28 + in_RDI->intra_factor;
      in_RDI->intra_skip_count = local_58 + in_RDI->intra_skip_count;
      in_RDI->mv_count = local_70 + in_RDI->mv_count;
      in_RDI->neutral_count = local_60 + in_RDI->neutral_count;
      in_RDI->new_mv_count = local_50 + in_RDI->new_mv_count;
      in_RDI->second_ref_count = local_68 + in_RDI->second_ref_count;
      in_RDI->sr_coded_error = local_78 + in_RDI->sr_coded_error;
      in_RDI->sum_in_vectors = local_4c + in_RDI->sum_in_vectors;
      in_RDI->sum_mvc = local_44 + in_RDI->sum_mvc;
      in_RDI->sum_mvc_abs = local_3c + in_RDI->sum_mvc_abs;
      in_RDI->sum_mvcs = local_30 + in_RDI->sum_mvcs;
      in_RDI->sum_mvr = local_48 + in_RDI->sum_mvr;
      in_RDI->sum_mvr_abs = local_40 + in_RDI->sum_mvr_abs;
      in_RDI->sum_mvrs = local_38 + in_RDI->sum_mvrs;
    }
  }
  return in_RDI;
}

Assistant:

static FRAME_STATS accumulate_frame_stats(FRAME_STATS *mb_stats, int mb_rows,
                                          int mb_cols) {
  FRAME_STATS stats = { 0 };
  int i, j;

  stats.image_data_start_row = INVALID_ROW;
  for (j = 0; j < mb_rows; j++) {
    for (i = 0; i < mb_cols; i++) {
      FRAME_STATS mb_stat = mb_stats[j * mb_cols + i];
      stats.brightness_factor += mb_stat.brightness_factor;
      stats.coded_error += mb_stat.coded_error;
      stats.frame_avg_wavelet_energy += mb_stat.frame_avg_wavelet_energy;
      if (stats.image_data_start_row == INVALID_ROW &&
          mb_stat.image_data_start_row != INVALID_ROW) {
        stats.image_data_start_row = mb_stat.image_data_start_row;
      }
      stats.inter_count += mb_stat.inter_count;
      stats.intra_error += mb_stat.intra_error;
      stats.intra_factor += mb_stat.intra_factor;
      stats.intra_skip_count += mb_stat.intra_skip_count;
      stats.mv_count += mb_stat.mv_count;
      stats.neutral_count += mb_stat.neutral_count;
      stats.new_mv_count += mb_stat.new_mv_count;
      stats.second_ref_count += mb_stat.second_ref_count;
      stats.sr_coded_error += mb_stat.sr_coded_error;
      stats.sum_in_vectors += mb_stat.sum_in_vectors;
      stats.sum_mvc += mb_stat.sum_mvc;
      stats.sum_mvc_abs += mb_stat.sum_mvc_abs;
      stats.sum_mvcs += mb_stat.sum_mvcs;
      stats.sum_mvr += mb_stat.sum_mvr;
      stats.sum_mvr_abs += mb_stat.sum_mvr_abs;
      stats.sum_mvrs += mb_stat.sum_mvrs;
    }
  }
  return stats;
}